

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
::get_ubjson_object(binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                    *this)

{
  undefined8 uVar1;
  bool bVar2;
  byte bVar3;
  char *in_RDI;
  string_t *unaff_retaddr;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000008;
  size_t i_1;
  size_t i;
  string_t key;
  string last_token;
  pair<unsigned_long,_int> size_and_type;
  char_int_type in_stack_00000214;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000218;
  undefined1 in_stack_0000025f;
  pair<unsigned_long,_int> *in_stack_00000260;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_00000268;
  byte local_165;
  undefined1 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea1;
  undefined1 in_stack_fffffffffffffea2;
  undefined1 in_stack_fffffffffffffea3;
  undefined1 in_stack_fffffffffffffea4;
  undefined1 in_stack_fffffffffffffea5;
  undefined1 in_stack_fffffffffffffea6;
  undefined1 in_stack_fffffffffffffea7;
  undefined8 in_stack_fffffffffffffea8;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffeb0;
  long *plVar4;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_fffffffffffffee8;
  ulong uVar5;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  string *in_stack_fffffffffffffef8;
  input_format_t in_stack_ffffffffffffff04;
  binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
  *in_stack_ffffffffffffff08;
  allocator<char> local_e1;
  string local_e0 [55];
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [32];
  undefined1 local_68 [24];
  void *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  pair<unsigned_long,_int> local_20;
  undefined1 in_stack_ffffffffffffffff;
  
  std::pair<unsigned_long,_int>::pair<unsigned_long,_int,_true>(&local_20);
  bVar2 = get_ubjson_size_type(in_stack_00000268,in_stack_00000260,(bool)in_stack_0000025f);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    bVar3 = 0;
    goto LAB_00280565;
  }
  if (((*(int *)(in_RDI + 0x24) == 5) && (local_20.first != 0xffffffffffffffff)) &&
     ((local_20.second & 0x100U) != 0)) {
    get_token_string(in_stack_fffffffffffffee8);
    plVar4 = *(long **)(in_RDI + 0x28);
    uVar1 = *(undefined8 *)(in_RDI + 0x18);
    __a = &local_a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffee0,in_RDI,__a);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(in_stack_fffffffffffffee0,in_RDI,__a);
    exception_message(in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,
                      (string *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    parse_error::create<std::nullptr_t,_0>
              (in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    bVar3 = (**(code **)(*plVar4 + 0x60))(plVar4,uVar1,&stack0xffffffffffffffc0,local_68);
    bVar3 = bVar3 & 1;
    parse_error::~parse_error((parse_error *)0x280089);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_e0);
    std::allocator<char>::~allocator(&local_e1);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator(&local_a9);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    goto LAB_00280565;
  }
  std::__cxx11::string::string((string *)&stack0xfffffffffffffef8);
  if (local_20.first == 0xffffffffffffffff) {
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x38))
                      (*(long **)(in_RDI + 0x28),0xffffffffffffffff);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      while (*(int *)(in_RDI + 0x10) != 0x7d) {
        bVar2 = get_ubjson_string(in_stack_00000008,unaff_retaddr,(bool)in_stack_ffffffffffffffff);
        local_165 = 1;
        if (bVar2) {
          local_165 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))
                                (*(long **)(in_RDI + 0x28),&stack0xfffffffffffffef8);
          local_165 = local_165 ^ 0xff;
        }
        if ((local_165 & 1) != 0) {
          bVar3 = 0;
          goto LAB_0028055b;
        }
        bVar2 = parse_ubjson_internal
                          (in_stack_fffffffffffffeb0,
                           SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
        if (((bVar2 ^ 0xffU) & 1) != 0) {
          bVar3 = 0;
          goto LAB_0028055b;
        }
        get_ignore_noop((binary_reader<nlohmann::json_abi_v3_11_3::basic_json<nlohmann::json_abi_v3_11_3::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_json_error_locator>
                         *)CONCAT17(in_stack_fffffffffffffea7,
                                    CONCAT16(in_stack_fffffffffffffea6,
                                             CONCAT15(in_stack_fffffffffffffea5,
                                                      CONCAT14(in_stack_fffffffffffffea4,
                                                               CONCAT13(in_stack_fffffffffffffea3,
                                                                        CONCAT12(
                                                  in_stack_fffffffffffffea2,
                                                  CONCAT11(in_stack_fffffffffffffea1,
                                                           in_stack_fffffffffffffea0))))))));
        std::__cxx11::string::clear();
      }
      goto LAB_00280530;
    }
    bVar3 = 0;
  }
  else {
    bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x38))
                      (*(long **)(in_RDI + 0x28),local_20.first);
    if (((bVar3 ^ 0xff) & 1) == 0) {
      if (local_20.second == 0) {
        for (uVar5 = 0; uVar5 < local_20.first; uVar5 = uVar5 + 1) {
          bVar2 = get_ubjson_string(in_stack_00000008,unaff_retaddr,(bool)in_stack_ffffffffffffffff)
          ;
          bVar3 = 1;
          if (bVar2) {
            bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))
                              (*(long **)(in_RDI + 0x28),&stack0xfffffffffffffef8);
            bVar3 = bVar3 ^ 0xff;
          }
          if ((bVar3 & 1) != 0) {
            bVar3 = 0;
            goto LAB_0028055b;
          }
          bVar2 = parse_ubjson_internal
                            (in_stack_fffffffffffffeb0,
                             SUB81((ulong)in_stack_fffffffffffffea8 >> 0x38,0));
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            bVar3 = 0;
            goto LAB_0028055b;
          }
          std::__cxx11::string::clear();
        }
      }
      else {
        for (uVar5 = 0; uVar5 < local_20.first; uVar5 = uVar5 + 1) {
          bVar2 = get_ubjson_string(in_stack_00000008,unaff_retaddr,(bool)in_stack_ffffffffffffffff)
          ;
          bVar3 = 1;
          if (bVar2) {
            bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x40))
                              (*(long **)(in_RDI + 0x28),&stack0xfffffffffffffef8);
            bVar3 = bVar3 ^ 0xff;
          }
          if ((bVar3 & 1) != 0) {
            bVar3 = 0;
            goto LAB_0028055b;
          }
          bVar2 = get_ubjson_value(in_stack_00000218,in_stack_00000214);
          if (((bVar2 ^ 0xffU) & 1) != 0) {
            bVar3 = 0;
            goto LAB_0028055b;
          }
          std::__cxx11::string::clear();
        }
      }
LAB_00280530:
      bVar3 = (**(code **)(**(long **)(in_RDI + 0x28) + 0x48))();
      bVar3 = bVar3 & 1;
    }
    else {
      bVar3 = 0;
    }
  }
LAB_0028055b:
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffef8);
LAB_00280565:
  return (bool)(bVar3 & 1);
}

Assistant:

bool get_ubjson_object()
    {
        std::pair<std::size_t, char_int_type> size_and_type;
        if (JSON_HEDLEY_UNLIKELY(!get_ubjson_size_type(size_and_type)))
        {
            return false;
        }

        // do not accept ND-array size in objects in BJData
        if (input_format == input_format_t::bjdata && size_and_type.first != npos && (size_and_type.second & (1 << 8)) != 0)
        {
            auto last_token = get_token_string();
            return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read,
                                    exception_message(input_format, "BJData object does not support ND-array size in optimized format", "object"), nullptr));
        }

        string_t key;
        if (size_and_type.first != npos)
        {
            if (JSON_HEDLEY_UNLIKELY(!sax->start_object(size_and_type.first)))
            {
                return false;
            }

            if (size_and_type.second != 0)
            {
                for (std::size_t i = 0; i < size_and_type.first; ++i)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_string(key) || !sax->key(key)))
                    {
                        return false;
                    }
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_value(size_and_type.second)))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
            else
            {
                for (std::size_t i = 0; i < size_and_type.first; ++i)
                {
                    if (JSON_HEDLEY_UNLIKELY(!get_ubjson_string(key) || !sax->key(key)))
                    {
                        return false;
                    }
                    if (JSON_HEDLEY_UNLIKELY(!parse_ubjson_internal()))
                    {
                        return false;
                    }
                    key.clear();
                }
            }
        }
        else
        {
            if (JSON_HEDLEY_UNLIKELY(!sax->start_object(static_cast<std::size_t>(-1))))
            {
                return false;
            }

            while (current != '}')
            {
                if (JSON_HEDLEY_UNLIKELY(!get_ubjson_string(key, false) || !sax->key(key)))
                {
                    return false;
                }
                if (JSON_HEDLEY_UNLIKELY(!parse_ubjson_internal()))
                {
                    return false;
                }
                get_ignore_noop();
                key.clear();
            }
        }

        return sax->end_object();
    }